

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

int wstran_listener_init(void *arg,nng_url *url,nni_listener *listener)

{
  uint16_t uVar1;
  int iVar2;
  nni_sock *sock;
  char *pcVar3;
  nng_stream_listener **wslp;
  char local_68 [8];
  char name [64];
  
  sock = nni_listener_sock(listener);
  *(nni_listener **)((long)arg + 0x218) = listener;
  nni_mtx_init((nni_mtx *)((long)arg + 0x20));
  nni_aio_list_init((nni_list *)((long)arg + 8));
  nni_aio_init((nni_aio *)((long)arg + 0x48),wstran_accept_cb,arg);
  nni_list_init_offset((nni_list *)((long)arg + 0x220),0x3e0);
  uVar1 = nni_sock_peer_id(sock);
  *(uint16_t *)arg = uVar1;
  pcVar3 = nni_sock_proto_name(sock);
  snprintf(local_68,0x40,"%s.sp.nanomsg.org",pcVar3);
  wslp = (nng_stream_listener **)((long)arg + 0x210);
  iVar2 = nni_ws_listener_alloc(wslp,url);
  if (iVar2 == 0) {
    iVar2 = nng_stream_listener_set_bool(*wslp,"ws:msgmode",true);
    if (iVar2 == 0) {
      iVar2 = nng_stream_listener_set_string(*wslp,"ws:protocol",local_68);
    }
  }
  return iVar2;
}

Assistant:

static int
wstran_listener_init(void *arg, nng_url *url, nni_listener *listener)
{
	ws_listener *l = arg;
	int          rv;
	nni_sock    *s = nni_listener_sock(listener);
	char         name[64];

	l->nlistener = listener;
	nni_mtx_init(&l->mtx);

	nni_aio_list_init(&l->aios);
	nni_aio_init(&l->accaio, wstran_accept_cb, l);
	NNI_LIST_INIT(&l->wait_pipes, ws_pipe, node);

	l->peer = nni_sock_peer_id(s);

	snprintf(
	    name, sizeof(name), "%s.sp.nanomsg.org", nni_sock_proto_name(s));

	if (((rv = nni_ws_listener_alloc(&l->listener, url)) != 0) ||
	    ((rv = nng_stream_listener_set_bool(
	          l->listener, NNI_OPT_WS_MSGMODE, true)) != 0) ||
	    ((rv = nng_stream_listener_set_string(
	          l->listener, NNG_OPT_WS_PROTOCOL, name)) != 0)) {
		return (rv);
	}
	return (0);
}